

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O2

void __thiscall mbc::Val::MessageBook::save(MessageBook *this)

{
  int iVar1;
  undefined4 extraout_var;
  Ch *pCVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_288;
  ofstream out;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_88;
  Stack<rapidjson::CrtAllocator> local_48;
  
  local_88.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48;
  local_48.stack_ = (char *)0x0;
  local_48.stackTop_ = (char *)0x0;
  local_48.allocator_ = (CrtAllocator *)0x0;
  local_48.ownAllocator_ = (CrtAllocator *)0x0;
  local_48.stackEnd_ = (char *)0x0;
  local_48.initialCapacity_ = 0x100;
  local_88.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_88.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_88.level_stack_.stack_ = (char *)0x0;
  local_88.level_stack_.stackTop_ = (char *)0x0;
  local_88.level_stack_.stackEnd_ = (char *)0x0;
  local_88.level_stack_.initialCapacity_ = 0x200;
  local_88.maxDecimalPlaces_ = 0x144;
  local_88.hasRoot_ = false;
  (*(this->super_ValBase)._vptr_ValBase[2])(&local_288,this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            (local_288,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&out);
  iVar1 = (*(this->path_->super__ValAtom).super_ValBase._vptr_ValBase[4])();
  std::ofstream::ofstream(&local_288,(string *)CONCAT44(extraout_var,iVar1),_S_out);
  pCVar2 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_48);
  std::operator<<((ostream *)&local_288,pCVar2);
  std::ofstream::~ofstream(&local_288);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_88.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_48);
  return;
}

Assistant:

void MessageBook::save() {
    StringBuffer buffer;
    Writer<StringBuffer> writer(buffer);
    json_value() -> Accept(writer);

    ofstream out(path_ -> raw());
    out << buffer.GetString();
}